

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deSharedPtr.hpp
# Opt level: O0

void __thiscall
de::SharedPtr<vkt::sr::TextureBinding>::SharedPtr
          (SharedPtr<vkt::sr::TextureBinding> *this,TextureBinding *ptr)

{
  TextureBinding *pTVar1;
  SharedPtrState<vkt::sr::TextureBinding,_de::DefaultDeleter<vkt::sr::TextureBinding>_> *pSVar2;
  DefaultDeleter<vkt::sr::TextureBinding> local_25 [13];
  TextureBinding *local_18;
  TextureBinding *ptr_local;
  SharedPtr<vkt::sr::TextureBinding> *this_local;
  
  this->m_ptr = (TextureBinding *)0x0;
  this->m_state = (SharedPtrStateBase *)0x0;
  this->m_ptr = ptr;
  local_18 = ptr;
  ptr_local = (TextureBinding *)this;
  pSVar2 = (SharedPtrState<vkt::sr::TextureBinding,_de::DefaultDeleter<vkt::sr::TextureBinding>_> *)
           operator_new(0x20);
  pTVar1 = local_18;
  DefaultDeleter<vkt::sr::TextureBinding>::DefaultDeleter(local_25);
  SharedPtrState<vkt::sr::TextureBinding,_de::DefaultDeleter<vkt::sr::TextureBinding>_>::
  SharedPtrState(pSVar2,pTVar1);
  this->m_state = (SharedPtrStateBase *)pSVar2;
  this->m_state->strongRefCount = 1;
  this->m_state->weakRefCount = 1;
  return;
}

Assistant:

inline SharedPtr<T>::SharedPtr (T* ptr)
	: m_ptr		(DE_NULL)
	, m_state	(DE_NULL)
{
	try
	{
		m_ptr	= ptr;
		m_state	= new SharedPtrState<T, DefaultDeleter<T> >(ptr, DefaultDeleter<T>());
		m_state->strongRefCount	= 1;
		m_state->weakRefCount	= 1;
	}
	catch (...)
	{
		// \note ptr is not released.
		delete m_state;
		throw;
	}
}